

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O1

bool __thiscall
jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::visit_end_object
          (basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *this,
          ser_context *context,error_code *ec)

{
  pointer plVar1;
  assertion_error *paVar2;
  char cVar3;
  string local_40;
  
  plVar1 = (this->level_stack_).
           super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (plVar1[-1].state_ == buffer) {
    cVar3 = (char)this + '8';
    std::__cxx11::string::push_back(cVar3);
    plVar1 = (this->level_stack_).
             super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)plVar1 -
                 (long)(this->level_stack_).
                       super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 2) {
      paVar2 = (assertion_error *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"assertion \'level_stack_.size() > 1\' failed at  <> :0","");
      assertion_error::assertion_error(paVar2,&local_40);
      __cxa_throw(paVar2,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    (this->level_stack_).
    super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
    ._M_impl.super__Vector_impl_data._M_finish = plVar1 + -1;
    if (plVar1[-2].state_ == destination) {
      local_40._M_string_length = (size_type)(this->key_buffer_)._M_dataplus._M_p;
      local_40._M_dataplus._M_p = (pointer)(this->key_buffer_)._M_string_length;
      (*this->destination_->_vptr_basic_json_visitor[9])(this->destination_,&local_40,context,ec);
      (this->key_buffer_)._M_string_length = 0;
      *(this->key_buffer_)._M_dataplus._M_p = '\0';
    }
    else if (plVar1[-2].even_odd_ == 0) {
      std::__cxx11::string::push_back(cVar3);
    }
    plVar1 = (this->level_stack_).
             super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (plVar1[-1].even_odd_ != 0) {
      plVar1[-1].count_ = plVar1[-1].count_ + 1;
    }
    if (plVar1[-1].type_ == object) {
      plVar1[-1].even_odd_ = (uint)(plVar1[-1].even_odd_ == 0);
    }
  }
  else {
    if ((ulong)(((long)plVar1 -
                 (long)(this->level_stack_).
                       super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) < 2) {
      paVar2 = (assertion_error *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"assertion \'level_stack_.size() > 1\' failed at  <> :0","");
      assertion_error::assertion_error(paVar2,&local_40);
      __cxa_throw(paVar2,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    (this->level_stack_).
    super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
    ._M_impl.super__Vector_impl_data._M_finish = plVar1 + -1;
    if (plVar1[-2].even_odd_ != 0) {
      plVar1[-2].count_ = plVar1[-2].count_ + 1;
    }
    if (plVar1[-2].type_ == object) {
      plVar1[-2].even_odd_ = (uint)(plVar1[-2].even_odd_ == 0);
    }
    (*this->destination_->_vptr_basic_json_visitor[5])(this->destination_,context,ec);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_end_object(const ser_context& context, std::error_code& ec) override
        {
            switch (level_stack_.back().target())
            {
                case target_t::buffer:
                    key_buffer_.push_back('}');
                    JSONCONS_ASSERT(level_stack_.size() > 1);
                    level_stack_.pop_back();
                    
                    if (level_stack_.back().target() == target_t::destination)
                    {
                        destination_->key(key_buffer_,context, ec);
                        key_buffer_.clear();
                    }
                    else if (level_stack_.back().is_key())
                    {
                        key_buffer_.push_back(':');
                    }
                    level_stack_.back().advance();
                    break;
                default:
                    JSONCONS_ASSERT(level_stack_.size() > 1);
                    level_stack_.pop_back();
                    level_stack_.back().advance();
                    destination_->end_object(context, ec);
                    break;
            }
            JSONCONS_VISITOR_RETURN;
        }